

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# correctness.cc
# Opt level: O0

void __thiscall CorrectnessTest::regular_test(CorrectnessTest *this,uint64_t max)

{
  undefined8 key;
  ulong uVar1;
  allocator local_369;
  string local_368 [37];
  bool local_343;
  bool local_342;
  allocator local_341;
  string local_340 [32];
  undefined1 local_320 [40];
  string local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [37];
  bool local_2ab;
  bool local_2aa;
  allocator local_2a9;
  string local_2a8 [32];
  undefined1 local_288 [40];
  string local_260 [39];
  allocator local_239;
  string local_238 [32];
  undefined1 local_218 [40];
  string local_1f0 [39];
  allocator local_1c9;
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [37];
  bool local_17b;
  bool local_17a;
  allocator local_179;
  string local_178 [32];
  undefined1 local_158 [40];
  string local_130 [37];
  bool local_10b;
  bool local_10a;
  allocator local_109;
  string local_108 [32];
  undefined1 local_e8 [40];
  string local_c0 [39];
  allocator local_99;
  string local_98 [55];
  allocator local_61;
  string local_60 [32];
  undefined1 local_40 [40];
  uint64_t i;
  uint64_t max_local;
  CorrectnessTest *this_local;
  
  i = max;
  max_local = (uint64_t)this;
  KVStore::get_abi_cxx11_((KVStore *)local_40,(uint64_t)&(this->super_Test).store);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_60,
             "/workspace/llm4binary/github/license_all_cmakelists_25/markcty[P]LSM-KV/correctness.cc"
             ,&local_61);
  Test::expect<std::__cxx11::string>
            (&this->super_Test,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Test::not_found_abi_cxx11_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
             (string *)local_60,0x10);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::~string((string *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"SE",&local_99);
  KVStore::put(&(this->super_Test).store,1,(string *)local_98);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"SE",(allocator *)(local_e8 + 0x27));
  KVStore::get_abi_cxx11_((KVStore *)local_e8,(uint64_t)&(this->super_Test).store);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_108,
             "/workspace/llm4binary/github/license_all_cmakelists_25/markcty[P]LSM-KV/correctness.cc"
             ,&local_109);
  Test::expect<std::__cxx11::string>
            (&this->super_Test,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
             (string *)local_108,0x12);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)(local_e8 + 0x27));
  local_10a = true;
  local_10b = KVStore::del(&(this->super_Test).store,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_130,
             "/workspace/llm4binary/github/license_all_cmakelists_25/markcty[P]LSM-KV/correctness.cc"
             ,(allocator *)(local_158 + 0x27));
  Test::expect<bool>(&this->super_Test,&local_10a,&local_10b,(string *)local_130,0x13);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)(local_158 + 0x27));
  KVStore::get_abi_cxx11_((KVStore *)local_158,(uint64_t)&(this->super_Test).store);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_178,
             "/workspace/llm4binary/github/license_all_cmakelists_25/markcty[P]LSM-KV/correctness.cc"
             ,&local_179);
  Test::expect<std::__cxx11::string>
            (&this->super_Test,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Test::not_found_abi_cxx11_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
             (string *)local_178,0x14);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::__cxx11::string::~string((string *)local_158);
  local_17a = false;
  local_17b = KVStore::del(&(this->super_Test).store,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/markcty[P]LSM-KV/correctness.cc"
             ,&local_1a1);
  Test::expect<bool>(&this->super_Test,&local_17a,&local_17b,(string *)local_1a0,0x15);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  Test::phase(&this->super_Test);
  for (local_40._32_8_ = 0; key = local_40._32_8_, (ulong)local_40._32_8_ < i;
      local_40._32_8_ = local_40._32_8_ + 1) {
    uVar1 = local_40._32_8_ + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c8,uVar1,'s',&local_1c9);
    KVStore::put(&(this->super_Test).store,key,(string *)local_1c8);
    std::__cxx11::string::~string(local_1c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
    uVar1 = local_40._32_8_ + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f0,uVar1,'s',(allocator *)(local_218 + 0x27));
    KVStore::get_abi_cxx11_((KVStore *)local_218,(uint64_t)&(this->super_Test).store);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_238,
               "/workspace/llm4binary/github/license_all_cmakelists_25/markcty[P]LSM-KV/correctness.cc"
               ,&local_239);
    Test::expect<std::__cxx11::string>
              (&this->super_Test,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
               (string *)local_238,0x1c);
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
    std::__cxx11::string::~string((string *)local_218);
    std::__cxx11::string::~string(local_1f0);
    std::allocator<char>::~allocator((allocator<char> *)(local_218 + 0x27));
  }
  Test::phase(&this->super_Test);
  for (local_40._32_8_ = 0; (ulong)local_40._32_8_ < i; local_40._32_8_ = local_40._32_8_ + 1) {
    uVar1 = local_40._32_8_ + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_260,uVar1,'s',(allocator *)(local_288 + 0x27));
    KVStore::get_abi_cxx11_((KVStore *)local_288,(uint64_t)&(this->super_Test).store);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_2a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/markcty[P]LSM-KV/correctness.cc"
               ,&local_2a9);
    Test::expect<std::__cxx11::string>
              (&this->super_Test,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
               (string *)local_2a8,0x22);
    std::__cxx11::string::~string(local_2a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
    std::__cxx11::string::~string((string *)local_288);
    std::__cxx11::string::~string(local_260);
    std::allocator<char>::~allocator((allocator<char> *)(local_288 + 0x27));
  }
  Test::phase(&this->super_Test);
  for (local_40._32_8_ = 0; (ulong)local_40._32_8_ < i; local_40._32_8_ = local_40._32_8_ + 2) {
    local_2aa = true;
    local_2ab = KVStore::del(&(this->super_Test).store,local_40._32_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_2d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/markcty[P]LSM-KV/correctness.cc"
               ,&local_2d1);
    Test::expect<bool>(&this->super_Test,&local_2aa,&local_2ab,(string *)local_2d0,0x27);
    std::__cxx11::string::~string(local_2d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  }
  for (local_40._32_8_ = 0; (ulong)local_40._32_8_ < i; local_40._32_8_ = local_40._32_8_ + 1) {
    local_320[0x26] = 0;
    if ((local_40._32_8_ & 1) == 0) {
      std::__cxx11::string::string(local_2f8,(string *)Test::not_found_abi_cxx11_);
    }
    else {
      uVar1 = local_40._32_8_ + 1;
      std::allocator<char>::allocator();
      local_320[0x26] = 1;
      std::__cxx11::string::string(local_2f8,uVar1,'s',(allocator *)(local_320 + 0x27));
    }
    KVStore::get_abi_cxx11_((KVStore *)local_320,(uint64_t)&(this->super_Test).store);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_340,
               "/workspace/llm4binary/github/license_all_cmakelists_25/markcty[P]LSM-KV/correctness.cc"
               ,&local_341);
    Test::expect<std::__cxx11::string>
              (&this->super_Test,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320,
               (string *)local_340,0x2a);
    std::__cxx11::string::~string(local_340);
    std::allocator<char>::~allocator((allocator<char> *)&local_341);
    std::__cxx11::string::~string((string *)local_320);
    std::__cxx11::string::~string(local_2f8);
    if ((local_320[0x26] & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)(local_320 + 0x27));
    }
  }
  for (local_40._32_8_ = 1; (ulong)local_40._32_8_ < i; local_40._32_8_ = local_40._32_8_ + 1) {
    local_342 = (bool)(local_40[0x20] & 1);
    local_343 = KVStore::del(&(this->super_Test).store,local_40._32_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_368,
               "/workspace/llm4binary/github/license_all_cmakelists_25/markcty[P]LSM-KV/correctness.cc"
               ,&local_369);
    Test::expect<bool>(&this->super_Test,&local_342,&local_343,(string *)local_368,0x2c);
    std::__cxx11::string::~string(local_368);
    std::allocator<char>::~allocator((allocator<char> *)&local_369);
  }
  Test::phase(&this->super_Test);
  Test::report(&this->super_Test);
  return;
}

Assistant:

void regular_test(uint64_t max) {
    uint64_t i;

    // Test a single key
    EXPECT(not_found, store.get(1));
    store.put(1, "SE");
    EXPECT("SE", store.get(1));
    EXPECT(true, store.del(1));
    EXPECT(not_found, store.get(1));
    EXPECT(false, store.del(1));

    phase();

    // Test multiple key-value pairs
    for (i = 0; i < max; ++i) {
      store.put(i, std::string(i + 1, 's'));
      EXPECT(std::string(i + 1, 's'), store.get(i));
    }
    phase();

    // Test after all insertions
    for (i = 0; i < max; ++i) {
      EXPECT(std::string(i + 1, 's'), store.get(i));
    }
    phase();

    // Test deletions
    for (i = 0; i < max; i += 2) EXPECT(true, store.del(i));

    for (i = 0; i < max; ++i)
      EXPECT((i & 1) ? std::string(i + 1, 's') : not_found, store.get(i));

    for (i = 1; i < max; ++i) EXPECT(i & 1, store.del(i));

    phase();

    report();
  }